

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_btlazy2_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  ZSTD_matchState_t *pZVar3;
  seqDef *psVar4;
  int iVar5;
  bool bVar6;
  undefined8 uVar7;
  uint uVar8;
  size_t sVar9;
  size_t sVar10;
  uint uVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  int *piVar16;
  U32 UVar17;
  U32 UVar18;
  int *piVar19;
  int *piVar20;
  long lVar21;
  U32 UVar22;
  U32 UVar23;
  ulong uVar24;
  int iVar25;
  size_t offsetFound;
  BYTE *litLimit_w;
  size_t local_b8;
  int *local_b0;
  size_t local_a8;
  int *local_a0;
  uint local_94;
  BYTE *local_90;
  ulong local_88;
  BYTE *local_80;
  int *local_78;
  seqStore_t *local_70;
  BYTE *local_68;
  int *local_60;
  BYTE *local_58;
  BYTE *local_50;
  ZSTD_matchState_t *local_48;
  U32 *local_40;
  BYTE *local_38;
  
  pBVar12 = (BYTE *)((long)src + srcSize);
  local_78 = (int *)((long)src + (srcSize - 8));
  pBVar2 = (ms->window).base;
  local_94 = (ms->window).dictLimit;
  uVar24 = (ulong)local_94;
  local_80 = pBVar2 + uVar24;
  UVar23 = *rep;
  pZVar3 = ms->dictMatchState;
  local_68 = (pZVar3->window).nextSrc;
  local_50 = (pZVar3->window).base;
  local_38 = local_50 + (pZVar3->window).dictLimit;
  UVar18 = rep[1];
  piVar16 = (int *)((ulong)(((int)src - ((int)local_38 + (int)local_80)) + (int)local_68 == 0) +
                   (long)src);
  local_a0 = (int *)src;
  local_40 = rep;
  if (piVar16 < local_78) {
    local_94 = ((int)local_50 - (int)local_68) + local_94;
    local_58 = local_50 + -(ulong)local_94;
    local_60 = (int *)(pBVar12 + -0x20);
    local_90 = pBVar12;
    local_88 = uVar24;
    local_70 = seqStore;
    local_48 = ms;
    do {
      iVar25 = (int)pBVar2;
      uVar8 = (((int)piVar16 - iVar25) - UVar23) + 1;
      uVar11 = (uint)uVar24;
      piVar19 = (int *)(pBVar2 + uVar8);
      if (uVar8 < uVar11) {
        piVar19 = (int *)(local_50 + (uVar8 - local_94));
      }
      if ((uVar8 - uVar11 < 0xfffffffd) && (*piVar19 == *(int *)((long)piVar16 + 1))) {
        pBVar15 = pBVar12;
        if (uVar8 < uVar11) {
          pBVar15 = local_68;
        }
        sVar9 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar16 + 5),(BYTE *)(piVar19 + 1),pBVar12,pBVar15,
                           local_80);
        uVar24 = sVar9 + 4;
      }
      else {
        uVar24 = 0;
      }
      local_a8 = 999999999;
      sVar10 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS
                         (local_48,(BYTE *)piVar16,pBVar12,&local_a8);
      sVar9 = uVar24;
      if (uVar24 < sVar10) {
        sVar9 = sVar10;
      }
      if (sVar9 < 4) {
        piVar16 = (int *)((long)piVar16 + ((long)piVar16 - (long)local_a0 >> 8) + 1);
        uVar24 = local_88;
        pBVar12 = local_90;
      }
      else {
        local_b0 = piVar16;
        local_b8 = local_a8;
        if (sVar10 <= uVar24) {
          local_b8 = 0;
          local_b0 = (int *)((long)piVar16 + 1);
        }
        if (piVar16 < local_78) {
          do {
            piVar19 = (int *)((long)piVar16 + 1);
            uVar8 = ((int)piVar19 - iVar25) - UVar23;
            uVar11 = (uint)local_88;
            piVar20 = (int *)(pBVar2 + uVar8);
            if (uVar8 < uVar11) {
              piVar20 = (int *)(local_50 + (uVar8 - local_94));
            }
            if ((uVar8 - uVar11 < 0xfffffffd) && (*piVar20 == *piVar19)) {
              pBVar12 = local_90;
              if (uVar8 < uVar11) {
                pBVar12 = local_68;
              }
              sVar10 = ZSTD_count_2segments
                                 ((BYTE *)((long)piVar16 + 5),(BYTE *)(piVar20 + 1),local_90,pBVar12
                                  ,local_80);
              if (sVar10 < 0xfffffffffffffffc) {
                uVar11 = (int)local_b8 + 1;
                uVar8 = 0x1f;
                if (uVar11 != 0) {
                  for (; uVar11 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                  }
                }
                if ((int)((uVar8 ^ 0x1f) + (int)sVar9 * 3 + -0x1e) < (int)(sVar10 + 4) * 3) {
                  local_b8 = 0;
                  sVar9 = sVar10 + 4;
                  local_b0 = piVar19;
                }
              }
            }
            local_a8 = 999999999;
            sVar10 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS
                               (local_48,(BYTE *)piVar19,local_90,&local_a8);
            bVar6 = true;
            if (3 < sVar10) {
              uVar11 = (int)local_b8 + 1;
              uVar8 = 0x1f;
              if (uVar11 != 0) {
                for (; uVar11 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                }
              }
              uVar11 = (int)local_a8 + 1;
              iVar5 = 0x1f;
              if (uVar11 != 0) {
                for (; uVar11 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                }
              }
              if ((int)((uVar8 ^ 0x1f) + (int)sVar9 * 4 + -0x1b) < (int)sVar10 * 4 - iVar5) {
                bVar6 = false;
                local_b8 = local_a8;
                sVar9 = sVar10;
                local_b0 = piVar19;
              }
            }
            if (bVar6) {
              if (local_78 <= piVar19) break;
              piVar19 = (int *)((long)piVar16 + 2);
              uVar8 = ((int)piVar19 - iVar25) - UVar23;
              uVar11 = (uint)local_88;
              piVar20 = (int *)(pBVar2 + uVar8);
              if (uVar8 < uVar11) {
                piVar20 = (int *)(local_50 + (uVar8 - local_94));
              }
              if ((uVar8 - uVar11 < 0xfffffffd) && (*piVar20 == *piVar19)) {
                pBVar12 = local_90;
                if (uVar8 < uVar11) {
                  pBVar12 = local_68;
                }
                sVar10 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar16 + 6),(BYTE *)(piVar20 + 1),local_90,
                                    pBVar12,local_80);
                if (sVar10 < 0xfffffffffffffffc) {
                  uVar11 = (int)local_b8 + 1;
                  uVar8 = 0x1f;
                  if (uVar11 != 0) {
                    for (; uVar11 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                    }
                  }
                  if ((int)((uVar8 ^ 0x1f) + (int)sVar9 * 4 + -0x1e) < (int)(sVar10 + 4) * 4) {
                    local_b8 = 0;
                    sVar9 = sVar10 + 4;
                    local_b0 = piVar19;
                  }
                }
              }
              local_a8 = 999999999;
              sVar10 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS
                                 (local_48,(BYTE *)piVar19,local_90,&local_a8);
              bVar6 = true;
              if (3 < sVar10) {
                uVar11 = (int)local_b8 + 1;
                uVar8 = 0x1f;
                if (uVar11 != 0) {
                  for (; uVar11 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                  }
                }
                uVar11 = (int)local_a8 + 1;
                iVar5 = 0x1f;
                if (uVar11 != 0) {
                  for (; uVar11 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                  }
                }
                if ((int)((uVar8 ^ 0x1f) + (int)sVar9 * 4 + -0x18) < (int)sVar10 * 4 - iVar5) {
                  bVar6 = false;
                  local_b8 = local_a8;
                  sVar9 = sVar10;
                  local_b0 = piVar19;
                }
              }
              if (bVar6) break;
            }
            piVar16 = piVar19;
          } while (piVar16 < local_78);
        }
        pBVar12 = local_90;
        if (local_b8 == 0) {
          UVar17 = 1;
          UVar22 = UVar23;
        }
        else {
          pBVar13 = (BYTE *)((long)local_b0 + (-(long)pBVar2 - local_b8) + -0xfffffffe);
          pBVar14 = pBVar2;
          pBVar15 = local_80;
          if ((uint)pBVar13 < (uint)local_88) {
            pBVar14 = local_58;
            pBVar15 = local_38;
          }
          if ((local_a0 < local_b0) &&
             (uVar24 = (ulong)pBVar13 & 0xffffffff, pBVar15 < pBVar14 + uVar24)) {
            pBVar14 = pBVar14 + uVar24;
            do {
              pBVar14 = pBVar14 + -1;
              piVar16 = (int *)((long)local_b0 + -1);
              if ((*(BYTE *)piVar16 != *pBVar14) ||
                 (sVar9 = sVar9 + 1, local_b0 = piVar16, piVar16 <= local_a0)) break;
            } while (pBVar15 < pBVar14);
          }
          UVar17 = (int)local_b8 + 1;
          UVar22 = (int)local_b8 - 2;
          UVar18 = UVar23;
        }
        uVar24 = (long)local_b0 - (long)local_a0;
        if (local_60 < local_b0) {
          pBVar14 = local_70->lit;
          pBVar15 = pBVar14;
          piVar16 = local_a0;
          if (local_a0 <= local_60) {
            pBVar15 = pBVar14 + ((long)local_60 - (long)local_a0);
            uVar7 = *(undefined8 *)(local_a0 + 2);
            *(undefined8 *)pBVar14 = *(undefined8 *)local_a0;
            *(undefined8 *)(pBVar14 + 8) = uVar7;
            piVar16 = local_60;
            if (0x10 < (long)local_60 - (long)local_a0) {
              lVar21 = 0x10;
              do {
                uVar7 = *(undefined8 *)((BYTE *)((long)local_a0 + lVar21) + 8);
                pBVar13 = pBVar14 + lVar21;
                *(undefined8 *)pBVar13 = *(undefined8 *)((long)local_a0 + lVar21);
                *(undefined8 *)(pBVar13 + 8) = uVar7;
                pBVar1 = (BYTE *)((long)local_a0 + lVar21 + 0x10);
                uVar7 = *(undefined8 *)(pBVar1 + 8);
                *(undefined8 *)(pBVar13 + 0x10) = *(undefined8 *)pBVar1;
                *(undefined8 *)(pBVar13 + 0x18) = uVar7;
                lVar21 = lVar21 + 0x20;
              } while (pBVar13 + 0x20 < pBVar15);
            }
          }
          if (piVar16 < local_b0) {
            lVar21 = 0;
            do {
              pBVar15[lVar21] = *(BYTE *)((long)piVar16 + lVar21);
              lVar21 = lVar21 + 1;
            } while ((long)local_b0 - (long)piVar16 != lVar21);
          }
        }
        else {
          pBVar15 = local_70->lit;
          uVar7 = *(undefined8 *)(local_a0 + 2);
          *(undefined8 *)pBVar15 = *(undefined8 *)local_a0;
          *(undefined8 *)(pBVar15 + 8) = uVar7;
          if (0x10 < uVar24) {
            pBVar15 = local_70->lit;
            uVar7 = *(undefined8 *)(local_a0 + 6);
            *(undefined8 *)(pBVar15 + 0x10) = *(undefined8 *)(local_a0 + 4);
            *(undefined8 *)(pBVar15 + 0x18) = uVar7;
            if (0x20 < (long)uVar24) {
              lVar21 = 0;
              do {
                pBVar13 = (BYTE *)((long)local_a0 + lVar21 + 0x20);
                uVar7 = *(undefined8 *)(pBVar13 + 8);
                pBVar14 = pBVar15 + lVar21 + 0x20;
                *(undefined8 *)pBVar14 = *(undefined8 *)pBVar13;
                *(undefined8 *)(pBVar14 + 8) = uVar7;
                pBVar13 = (BYTE *)((long)local_a0 + lVar21 + 0x30);
                uVar7 = *(undefined8 *)(pBVar13 + 8);
                *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)pBVar13;
                *(undefined8 *)(pBVar14 + 0x18) = uVar7;
                lVar21 = lVar21 + 0x20;
              } while (pBVar14 + 0x20 < pBVar15 + uVar24);
            }
          }
        }
        local_70->lit = local_70->lit + uVar24;
        if (0xffff < uVar24) {
          local_70->longLengthType = ZSTD_llt_literalLength;
          local_70->longLengthPos =
               (U32)((ulong)((long)local_70->sequences - (long)local_70->sequencesStart) >> 3);
        }
        psVar4 = local_70->sequences;
        psVar4->litLength = (U16)uVar24;
        psVar4->offset = UVar17;
        if (0xffff < sVar9 - 3) {
          local_70->longLengthType = ZSTD_llt_matchLength;
          local_70->longLengthPos =
               (U32)((ulong)((long)psVar4 - (long)local_70->sequencesStart) >> 3);
        }
        psVar4->matchLength = (U16)(sVar9 - 3);
        local_70->sequences = psVar4 + 1;
        piVar16 = (int *)((long)local_b0 + sVar9);
        pBVar15 = local_58;
        uVar24 = local_88;
        local_a0 = piVar16;
        do {
          UVar23 = UVar22;
          if (local_78 < piVar16) break;
          uVar8 = ((int)piVar16 - iVar25) - UVar18;
          uVar11 = (uint)uVar24;
          pBVar14 = pBVar2;
          if (uVar8 < uVar11) {
            pBVar14 = pBVar15;
          }
          if ((uVar8 - uVar11 < 0xfffffffd) && (*(int *)(pBVar14 + uVar8) == *piVar16)) {
            pBVar15 = pBVar12;
            if (uVar8 < uVar11) {
              pBVar15 = local_68;
            }
            sVar9 = ZSTD_count_2segments
                              ((BYTE *)(piVar16 + 1),(BYTE *)((long)(pBVar14 + uVar8) + 4),pBVar12,
                               pBVar15,local_80);
            if (local_a0 <= local_60) {
              pBVar15 = local_70->lit;
              uVar7 = *(undefined8 *)(local_a0 + 2);
              *(undefined8 *)pBVar15 = *(undefined8 *)local_a0;
              *(undefined8 *)(pBVar15 + 8) = uVar7;
            }
            psVar4 = local_70->sequences;
            psVar4->litLength = 0;
            psVar4->offset = 1;
            if (0xffff < sVar9 + 1) {
              local_70->longLengthType = ZSTD_llt_matchLength;
              local_70->longLengthPos =
                   (U32)((ulong)((long)psVar4 - (long)local_70->sequencesStart) >> 3);
            }
            psVar4->matchLength = (U16)(sVar9 + 1);
            local_70->sequences = psVar4 + 1;
            piVar16 = (int *)((long)piVar16 + sVar9 + 4);
            bVar6 = true;
            pBVar15 = local_58;
            uVar24 = local_88;
            local_a0 = piVar16;
            UVar22 = UVar18;
          }
          else {
            bVar6 = false;
            UVar23 = UVar18;
          }
          UVar18 = UVar23;
          UVar23 = UVar22;
        } while (bVar6);
      }
    } while (piVar16 < local_78);
  }
  *local_40 = UVar23;
  local_40[1] = UVar18;
  return (long)pBVar12 - (long)local_a0;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_dictMatchState);
}